

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::
allocCallbackFailMultipleObjectsTest<vkt::api::(anonymous_namespace)::DescriptorSet>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  deInt32 *pdVar1;
  ostringstream *poVar2;
  pointer pbVar3;
  PlatformInterface *pPVar4;
  char *pcVar5;
  Context *this;
  bool bVar6;
  VkResult value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s;
  VkAllocationCallbacks *allocator;
  DeviceInterface *pDVar8;
  VkDevice pVVar9;
  Move<vk::Handle<(vk::HandleType)22>_> *pMVar10;
  Checked<vk::Handle<(vk::HandleType)22>_> CVar11;
  ulong uVar12;
  long *plVar13;
  size_type *psVar14;
  char **value_00;
  undefined8 uVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  long lVar17;
  VkDescriptorSetAllocateInfo allocateInfo;
  vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  descriptorSetLayouts;
  vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>_>_>
  scopedHandles;
  Resources res;
  Environment objEnv;
  DeterministicFailAllocator objAllocator;
  size_type __dnew;
  ulong local_340;
  SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_> local_330;
  Context *local_320;
  string local_318;
  pointer local_2f8;
  vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_> local_2f0
  ;
  pointer local_2d8;
  pointer local_2d0;
  Parameters *local_2c8;
  size_t local_2c0;
  vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>_>_>
  local_2b8;
  undefined1 local_298 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288 [5];
  value_type local_230 [2];
  ios_base local_220 [264];
  Environment local_118;
  DeterministicFailAllocator local_e0;
  AllocationCallbackRecorder local_90;
  
  local_90.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks =
       (_func_int **)0x13;
  local_2c8 = params;
  local_298._0_8_ = local_288;
  local_298._0_8_ = std::__cxx11::string::_M_create((ulong *)local_298,(ulong)&local_90);
  local_288[0]._M_allocated_capacity =
       local_90.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks;
  *(undefined8 *)local_298._0_8_ = 0x6d5f52484b5f4b56;
  *(undefined8 *)(local_298._0_8_ + 8) = 0x6e616e65746e6961;
  builtin_strncpy((char *)((long)(local_298._0_8_ + 8) + 7),"nce1",4);
  local_298._8_8_ =
       local_90.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks;
  *(char *)((long)local_90.super_ChainedAllocator.super_AllocationCallbacks.
                  _vptr_AllocationCallbacks + local_298._0_8_) = '\0';
  pvVar7 = Context::getDeviceExtensions_abi_cxx11_(context);
  pbVar3 = (pvVar7->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar7 = Context::getDeviceExtensions_abi_cxx11_(context);
  local_2d0 = (pvVar7->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_2d8 = (pointer)std::
                       __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                 (pbVar3,local_2d0,local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._0_8_ != local_288) {
    operator_delete((void *)local_298._0_8_,local_288[0]._M_allocated_capacity + 1);
  }
  __s = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)operator_new(0x20);
  psVar14 = &__s->_M_allocated_capacity + 1;
  if (&__s->_M_allocated_capacity + 1 < &__s->_M_allocated_capacity + 4) {
    psVar14 = &__s->_M_allocated_capacity + 4;
  }
  local_2c0 = ((long)psVar14 + ~(ulong)__s & 0xfffffffffffffff8) + 8;
  local_340 = 0;
  local_320 = context;
  while( true ) {
    this = local_320;
    memset(__s,0xde,local_2c0);
    allocator = ::vk::getSystemAllocator();
    ::vk::DeterministicFailAllocator::DeterministicFailAllocator
              (&local_e0,allocator,MODE_DO_NOT_COUNT,0);
    ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
              (&local_90,&local_e0.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks,0x80
              );
    pPVar4 = this->m_platformInterface;
    pDVar8 = Context::getDeviceInterface(this);
    pVVar9 = Context::getDevice(this);
    local_118.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(this);
    local_118.programBinaries = this->m_progCollection;
    local_118.allocationCallbacks =
         &local_90.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
    local_118.maxResourceConsumers = 4;
    local_298._0_8_ = this->m_testCtx->m_log;
    poVar2 = (ostringstream *)(local_298 + 8);
    local_118.vkp = pPVar4;
    local_118.vkd = pDVar8;
    local_118.device = pVVar9;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Trying to create ",0x11);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," objects with ",0xe);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," allocation",0xb);
    pcVar5 = ",\n\t\t";
    if (local_340 != 1) {
      pcVar5 = "%s<%s";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,pcVar5 + 4,(ulong)(local_340 != 1));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_298 + 8)," passing",8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_298,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_298 + 8));
    std::ios_base::~ios_base(local_220);
    DescriptorSet::Resources::Resources((Resources *)local_298,&local_118,local_2c8);
    ::vk::DeterministicFailAllocator::reset(&local_e0,MODE_COUNT_AND_FAIL,(deUint32)local_340);
    std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
    vector(&local_2f0,4,local_230,(allocator_type *)&local_318);
    local_318._M_dataplus._M_p._0_4_ = 0x22;
    local_318._M_string_length = 0;
    local_318.field_2._M_allocated_capacity = local_298._8_8_;
    local_318.field_2._8_4_ = 4;
    local_2f8 = local_2f0.
                super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    value = (*pDVar8->_vptr_DeviceInterface[0x3c])(pDVar8,pVVar9,&local_318,__s);
    local_2b8.
    super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b8.
    super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2b8.
    super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (value == VK_SUCCESS) {
      lVar17 = 0;
      do {
        pMVar10 = (Move<vk::Handle<(vk::HandleType)22>_> *)operator_new(0x20);
        CVar11 = ::vk::refdetails::check<vk::Handle<(vk::HandleType)22>>
                           ((Handle<(vk::HandleType)22>)(&__s->_M_allocated_capacity)[lVar17]);
        (pMVar10->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
             (deUint64)CVar11.object.m_internal;
        (pMVar10->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_deviceIface =
             local_118.vkd;
        (pMVar10->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_device =
             local_118.device;
        (pMVar10->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_pool.m_internal =
             local_298._8_8_;
        local_330.m_state = (SharedPtrStateBase *)0x0;
        local_330.m_ptr = pMVar10;
        local_330.m_state = (SharedPtrStateBase *)operator_new(0x20);
        (local_330.m_state)->strongRefCount = 0;
        (local_330.m_state)->weakRefCount = 0;
        (local_330.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00cef5f0;
        local_330.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pMVar10;
        (local_330.m_state)->strongRefCount = 1;
        (local_330.m_state)->weakRefCount = 1;
        std::
        vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>>>,std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>>>>>
        ::emplace_back<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>>>>
                  ((vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>>>,std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>>>>>
                    *)&local_2b8,&local_330);
        if (local_330.m_state != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &(local_330.m_state)->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_330.m_ptr = (Move<vk::Handle<(vk::HandleType)22>_> *)0x0;
            (*(local_330.m_state)->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &(local_330.m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if ((*pdVar1 == 0) && (local_330.m_state != (SharedPtrStateBase *)0x0)) {
            (*(local_330.m_state)->_vptr_SharedPtrStateBase[1])();
          }
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != 4);
    }
    if (local_2f0.
        super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2f0.
                      super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_2f0.
                            super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2f0.
                            super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>_>_>
    ::~vector(&local_2b8);
    DescriptorSet::Resources::~Resources((Resources *)local_298);
    if (value == VK_SUCCESS) {
      local_298._0_8_ = local_320->m_testCtx->m_log;
      poVar2 = (ostringstream *)(local_298 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Construction of all objects succeeded! ",0x27);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_298,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_220);
      ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_90);
      ::vk::ChainedAllocator::~ChainedAllocator(&local_e0.super_ChainedAllocator);
      operator_delete(__s,0x20);
      if (local_340 != 0) goto LAB_003ffa93;
      local_298._0_8_ = local_288;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_298,"Not validated: pooled objects didn\'t seem to use host memory"
                 ,"");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_298._0_8_,
                 local_298._0_8_ + local_298._8_8_);
      goto LAB_003ffc0d;
    }
    uVar12 = local_340;
    if (local_340 < 4 && local_2d8 != local_2d0) {
      do {
        if ((&__s->_M_allocated_capacity)[uVar12] != 0) {
          local_298._0_8_ = local_288;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_298,"Some object handles weren\'t set to NULL","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->m_description,local_298._0_8_,
                     local_298._0_8_ + local_298._8_8_);
          goto LAB_003ff99e;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != 4);
    }
    if (value != VK_ERROR_OUT_OF_HOST_MEMORY) break;
    bVar6 = ::vk::validateAndLog(local_320->m_testCtx->m_log,&local_90,0);
    if (!bVar6) {
      local_298._0_8_ = local_288;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_298,"Invalid allocation callback","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_298._0_8_,
                 local_298._0_8_ + local_298._8_8_);
LAB_003ff99e:
      uVar15 = local_288[0]._M_allocated_capacity;
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._0_8_ != local_288) goto LAB_003ff9b3;
      goto LAB_003ff9bb;
    }
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_90);
    ::vk::ChainedAllocator::~ChainedAllocator(&local_e0.super_ChainedAllocator);
    local_340 = local_340 + 1;
    if (local_340 == 5) {
      operator_delete(__s,0x20);
LAB_003ffa93:
      local_298._0_8_ = local_288;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"Ok","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_298._0_8_,
                 local_298._0_8_ + local_298._8_8_);
LAB_003ffc0d:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._0_8_ != local_288) {
        uVar12 = local_288[0]._M_allocated_capacity + 1;
        __s = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._0_8_;
LAB_003ff9dd:
        operator_delete(__s,uVar12);
      }
      return __return_storage_ptr__;
    }
  }
  local_2f0.
  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)::vk::getResultName(value);
  de::toString<char_const*>(&local_318,(de *)&local_2f0,value_00);
  plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_318,0,(char *)0x0,0xa9ec08);
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar13 == paVar16) {
    local_288[0]._0_8_ = paVar16->_M_allocated_capacity;
    local_288[0]._8_4_ = (undefined4)plVar13[3];
    local_288[0]._12_4_ = *(undefined4 *)((long)plVar13 + 0x1c);
    local_298._0_8_ = local_288;
  }
  else {
    local_288[0]._0_8_ = paVar16->_M_allocated_capacity;
    local_298._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar13;
  }
  local_298._8_8_ = plVar13[1];
  *plVar13 = (long)paVar16;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_298._0_8_,
             local_298._0_8_ + local_298._8_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._0_8_ != local_288) {
    operator_delete((void *)local_298._0_8_,local_288[0]._M_allocated_capacity + 1);
  }
  uVar15 = local_318.field_2._M_allocated_capacity;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_318._M_dataplus._M_p._4_4_,local_318._M_dataplus._M_p._0_4_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_318._M_dataplus._M_p._4_4_,local_318._M_dataplus._M_p._0_4_) !=
      &local_318.field_2) {
LAB_003ff9b3:
    operator_delete(paVar16,uVar15 + 1);
  }
LAB_003ff9bb:
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_90);
  ::vk::ChainedAllocator::~ChainedAllocator(&local_e0.super_ChainedAllocator);
  uVar12 = 0x20;
  goto LAB_003ff9dd;
}

Assistant:

tcu::TestStatus allocCallbackFailMultipleObjectsTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<Move<typename Object::Type> >	ObjectTypeSp;

	static const deUint32	numObjects			= 4;
	const bool				expectNullHandles	= isNullHandleOnAllocationFailure<typename Object::Type>(context);
	deUint32				numPassingAllocs	= 0;

	{
		vector<typename Object::Type>	handles	(numObjects);
		VkResult						result	= VK_NOT_READY;

		for (; numPassingAllocs <= numObjects; ++numPassingAllocs)
		{
			ValidateQueryBits::fillBits(handles.begin(), handles.end());	// fill with garbage

			// \note We have to use the same allocator for both resource dependencies and the object under test,
			//       because pooled objects take memory from the pool.
			DeterministicFailAllocator			objAllocator(getSystemAllocator(), DeterministicFailAllocator::MODE_DO_NOT_COUNT, 0);
			AllocationCallbackRecorder			recorder	(objAllocator.getCallbacks(), 128);
			const Environment					objEnv		(context.getPlatformInterface(),
															 context.getDeviceInterface(),
															 context.getDevice(),
															 context.getUniversalQueueFamilyIndex(),
															 context.getBinaryCollection(),
															 recorder.getCallbacks(),
															 numObjects);

			context.getTestContext().getLog()
				<< TestLog::Message
				<< "Trying to create " << numObjects << " objects with " << numPassingAllocs << " allocation" << (numPassingAllocs != 1 ? "s" : "") << " passing"
				<< TestLog::EndMessage;

			{
				const typename Object::Resources res (objEnv, params);

				objAllocator.reset(DeterministicFailAllocator::MODE_COUNT_AND_FAIL, numPassingAllocs);
				const vector<ObjectTypeSp> scopedHandles = Object::createMultiple(objEnv, res, params, &handles, &result);
			}

			if (result == VK_SUCCESS)
			{
				context.getTestContext().getLog() << TestLog::Message << "Construction of all objects succeeded! " << TestLog::EndMessage;
				break;
			}
			else
			{
				if (expectNullHandles)
				{
					for (deUint32 nullNdx = numPassingAllocs; nullNdx < numObjects; ++nullNdx)
					{
						if (handles[nullNdx] != DE_NULL)
							return tcu::TestStatus::fail("Some object handles weren't set to NULL");
					}
				}

				if (result != VK_ERROR_OUT_OF_HOST_MEMORY)
					return tcu::TestStatus::fail("Got invalid error code: " + de::toString(getResultName(result)));

				if (!validateAndLog(context.getTestContext().getLog(), recorder, 0u))
					return tcu::TestStatus::fail("Invalid allocation callback");
			}
		}
	}

	if (numPassingAllocs == 0)
	{
		if (isPooledObject<typename Object::Type>())
			return tcu::TestStatus::pass("Not validated: pooled objects didn't seem to use host memory");
		else
			return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Allocation callbacks not called");
	}
	else
		return tcu::TestStatus::pass("Ok");
}